

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBase.cpp
# Opt level: O3

Vector<int,_std::allocator<int>_> *
amrex::InterpBase::GetBCArray
          (Vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr)

{
  pointer pBVar1;
  long lVar2;
  ulong uVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  allocator_type local_11;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
             (long)(bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                   super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_11);
  pBVar1 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pBVar1;
  if (0 < (long)uVar3) {
    lVar2 = (uVar3 >> 3) * -0x5555555555555555;
    piVar4 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        piVar4[lVar6] = pBVar1->bc[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 6;
      pBVar1 = pBVar1 + 1;
    } while (lVar5 != lVar2 + (ulong)(lVar2 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
InterpBase::GetBCArray (const Vector<BCRec>& bcr)
{
    Vector<int> bc(2*AMREX_SPACEDIM*bcr.size());

    for (int n = 0; n < bcr.size(); n++)
    {
        const int* b_rec = bcr[n].vect();

        for (int m = 0; m < 2*AMREX_SPACEDIM; m++)
        {
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
        }
    }

    return bc;
}